

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::get_hash_for_shader_module
          (StateRecorder *this,VkShaderModule module,Hash *hash)

{
  VkShaderModule pVVar1;
  bool bVar2;
  iterator iVar3;
  long *in_FS_OFFSET;
  VkShaderModule local_18;
  
  local_18 = module;
  iVar3 = std::
          _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->impl->shader_module_to_hash)._M_h,&local_18);
  pVVar1 = local_18;
  if (iVar3.super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false>.
      _M_cur == (__node_type *)0x0) {
    if (*(int *)(*in_FS_OFFSET + -0x18) < 2) {
      bVar2 = Internal::log_thread_callback
                        (LOG_DEFAULT,
                         "%s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
                         ,"Shader module",local_18);
      if (!bVar2) {
        fprintf(_stderr,
                "Fossilize WARN: %s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
                ,"Shader module",pVVar1);
      }
    }
  }
  else {
    *hash = *(Hash *)((long)iVar3.
                            super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false>
                            ._M_cur + 0x10);
  }
  return iVar3.super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false>.
         _M_cur != (__node_type *)0x0;
}

Assistant:

bool StateRecorder::get_hash_for_shader_module(VkShaderModule module, Hash *hash) const
{
	auto itr = impl->shader_module_to_hash.find(module);
	if (itr == end(impl->shader_module_to_hash))
	{
		log_failed_hash("Shader module", module);
		return false;
	}
	else
	{
		*hash = itr->second;
		return true;
	}
}